

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idct.c
# Opt level: O0

void highbd_inv_txfm_add_64x64_c(tran_low_t *input,uint8_t *dest,int stride,TxfmParam *txfm_param)

{
  tran_low_t *in_RDI;
  int32_t *src;
  TX_TYPE tx_type;
  int bd;
  int in_stack_000081f4;
  TX_TYPE in_stack_000081fb;
  int in_stack_000081fc;
  uint16_t *in_stack_00008200;
  int32_t *in_stack_00008208;
  
  cast_to_int32(in_RDI);
  av1_inv_txfm2d_add_64x64_c
            (in_stack_00008208,in_stack_00008200,in_stack_000081fc,in_stack_000081fb,
             in_stack_000081f4);
  return;
}

Assistant:

static void highbd_inv_txfm_add_64x64_c(const tran_low_t *input, uint8_t *dest,
                                        int stride,
                                        const TxfmParam *txfm_param) {
  const int bd = txfm_param->bd;
  const TX_TYPE tx_type = txfm_param->tx_type;
  const int32_t *src = cast_to_int32(input);
  assert(tx_type == DCT_DCT);
  av1_inv_txfm2d_add_64x64_c(src, CONVERT_TO_SHORTPTR(dest), stride, tx_type,
                             bd);
}